

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O1

void run_sender(_Bool *err)

{
  pid_t __pid;
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  bool halt;
  undefined8 uStack_430;
  char local_428 [8];
  char buffer [1002];
  
  uStack_430 = 0x101b6b;
  pcVar4 = fgets(local_428,0x3ea,_stdin);
  if (pcVar4 != (char *)0x0) {
    do {
      uStack_430 = 0x101b83;
      sVar5 = strlen(local_428);
      local_428[sVar5 - 1] = '\0';
      cVar1 = local_428[0];
      halt = local_428[0] == '!';
      uStack_430 = 0x101ba6;
      uVar2 = getpid();
      uStack_430 = 0x101bbf;
      log_formatted("%d SND: %s, start=%d, halt=%d",(ulong)uVar2,local_428,(ulong)!halt);
      validator_mq_send(validator_mq,!halt,halt,halt,false,false,main_pid,local_428,&::err);
      __pid = main_pid;
      if (::err != false) goto LAB_00101c8c;
      if (cVar1 == '!') {
        local_428[0] = '\0';
        break;
      }
      uStack_430 = 0x101c0a;
      iVar3 = __libc_current_sigrtmin();
      uStack_430 = 0x101c15;
      iVar3 = kill(__pid,iVar3 + 1);
      if (iVar3 == -1) goto LAB_00101c8c;
      local_428[0] = '\0';
      uStack_430 = 0x101c38;
      pcVar4 = fgets(local_428,0x3ea,_stdin);
    } while (pcVar4 != (char *)0x0);
    if (cVar1 == '!') {
      return;
    }
  }
  validator_mq_send(validator_mq,false,false,true,false,false,main_pid,local_428,&::err);
  if (::err == true) {
LAB_00101c8c:
    ::err = true;
    uStack_430 = 0x101caf;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                  ,"run_sender");
  }
  return;
}

Assistant:

static void run_sender(bool *err) {
    int tmp_err = 0;
    bool start = true;
    bool halt = !start;
    char buffer[WORD_LEN_MAX+2]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin) != NULL) {
        assert(buffer[strlen(buffer)-1] == '\n');

        buffer[strlen(buffer)-1] = '\0';
        start = (buffer[0]!='!');
        halt = !start;

        log_formatted("%d SND: %s, start=%d, halt=%d", getpid(), buffer, start, halt);
        validator_mq_send(validator_mq, start, halt, halt, false, false, main_pid, buffer, err); // halt => completed
        VOID_FAIL_IF(*err); // pass error further

        if(!halt) {
            tmp_err = kill(main_pid, SIG_SNT_SUCCESS);
            VOID_FAIL_IF(tmp_err == -1);
        }

        buffer[0] = '\0'; // following shorter words cannot contain junk
        if(halt) {
            break; // no point in sending extra words
        }
    }
    if(!halt) {
        // halt => completed, so there is no point in sending second completed message
        validator_mq_send(validator_mq, false, false, true, false, false, main_pid, buffer, err);
        VOID_FAIL_IF(*err); // pass error further
    }
}